

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

void GC::CheckClass(char *ptr,ExternTypeInfo *type)

{
  ExternTypeInfo *type_00;
  ExternMemberInfo *local_58;
  uint pos;
  ExternTypeInfo *subType;
  uint n;
  ExternMemberInfo *memberList;
  ExternTypeInfo *realType;
  NULLCAutoArray *data_1;
  NULLCRef *data;
  ExternTypeInfo *type_local;
  char *ptr_local;
  
  if (type->nameHash == objectName) {
    if (*(long *)(ptr + 4) != 0) {
      CheckPointer(ptr + 4);
    }
  }
  else if (type->nameHash == autoArrayName) {
    if (*(long *)(ptr + 4) != 0) {
      CheckPointer(ptr + 4);
    }
  }
  else {
    if (type->pointerCount == 0) {
      local_58 = (ExternMemberInfo *)0x0;
    }
    else {
      local_58 = FastVector<ExternMemberInfo,_false,_false>::operator[]
                           ((FastVector<ExternMemberInfo,_false,_false> *)
                            (NULLC::commonLinker + 0x210),
                            (type->field_11).subType + (type->field_8).arrSize);
    }
    for (subType._4_4_ = 0; subType._4_4_ < type->pointerCount; subType._4_4_ = subType._4_4_ + 1) {
      type_00 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                          ((FastVector<ExternTypeInfo,_false,_false> *)(NULLC::commonLinker + 0x200)
                           ,local_58[subType._4_4_].type);
      CheckVariable(ptr + local_58[subType._4_4_].offset,type_00);
    }
  }
  return;
}

Assistant:

void CheckClass(char* ptr, const ExternTypeInfo& type)
	{
		if(type.nameHash == objectName)
		{
			NULLCRef *data = (NULLCRef*)ptr;

			// Skip uninitialized array
			if(!data->ptr)
				return;

			CheckPointer((char*)&data->ptr);
		}
		else if(type.nameHash == autoArrayName)
		{
			NULLCAutoArray *data = (NULLCAutoArray*)ptr;

			// Skip uninitialized array
			if(!data->ptr)
				return;

			// Check target data
			CheckPointer((char*)&data->ptr);
		}
		else
		{
			const ExternTypeInfo *realType = &type;

			// Get class member type list
			ExternMemberInfo *memberList = realType->pointerCount ? &NULLC::commonLinker->exTypeExtra[realType->memberOffset + realType->memberCount] : NULL;

			// Check pointer members
			for(unsigned n = 0; n < realType->pointerCount; n++)
			{
				// Get member type
				ExternTypeInfo &subType = NULLC::commonLinker->exTypes[memberList[n].type];
				unsigned pos = memberList[n].offset;

				// Check member
				CheckVariable(ptr + pos, subType);
			}
		}
	}